

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O2

bool dxil_spv::emit_cmpxchg_instruction(Impl *impl,AtomicCmpXchgInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Builder *this;
  Type *pTVar3;
  Operation *this_00;
  Value *pVVar4;
  Operation *this_01;
  Operation *this_02;
  Id local_54;
  Id local_50;
  uint local_4c;
  initializer_list<unsigned_int> local_48;
  undefined8 local_38;
  
  this = Converter::Impl::builder(impl);
  pTVar3 = LLVMBC::Value::getType((Value *)instruction);
  pTVar3 = LLVMBC::Type::getStructElementType(pTVar3,0);
  local_4c = LLVMBC::Type::getIntegerBitWidth(pTVar3);
  if (local_4c == 0x40) {
    spv::Builder::addCapability(this,CapabilityInt64Atomics);
  }
  IVar2 = spv::Builder::makeUintType(this,local_4c);
  this_00 = Converter::Impl::allocate(impl,OpAtomicCompareExchange,IVar2);
  pVVar4 = LLVMBC::AtomicCmpXchgInst::getPointerOperand(instruction);
  bVar1 = needs_group_shared_auto_barrier(impl,pVVar4);
  if (bVar1) {
    this_00->flags = this_00->flags | 4;
  }
  pVVar4 = LLVMBC::AtomicCmpXchgInst::getPointerOperand(instruction);
  IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  Operation::add_id(this_00,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,2,false);
  Operation::add_id(this_00,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  Operation::add_id(this_00,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  Operation::add_id(this_00,IVar2);
  pVVar4 = LLVMBC::AtomicCmpXchgInst::getNewValOperand(instruction);
  IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  Operation::add_id(this_00,IVar2);
  pVVar4 = LLVMBC::AtomicCmpXchgInst::getCompareOperand(instruction);
  IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  Operation::add_id(this_00,IVar2);
  Converter::Impl::add(impl,this_00,false);
  IVar2 = spv::Builder::makeBoolType(this);
  this_01 = Converter::Impl::allocate(impl,OpIEqual,IVar2);
  local_54 = this_00->id;
  pVVar4 = LLVMBC::AtomicCmpXchgInst::getCompareOperand(instruction);
  local_50 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  local_48._M_len = 2;
  local_48._M_array = &local_54;
  Operation::add_ids(this_01,&local_48);
  Converter::Impl::add(impl,this_01,false);
  IVar2 = impl->cmpxchg_type;
  if (IVar2 == 0) {
    local_54 = spv::Builder::makeUintType(this,local_4c);
    local_50 = spv::Builder::makeBoolType(this);
    local_48._M_array = (Id *)0x0;
    local_48._M_len = 0;
    local_38 = 0;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
               &local_54);
    IVar2 = Converter::Impl::get_struct_type(impl,(Vector<spv::Id> *)&local_48,0,"CmpXchgResult");
    impl->cmpxchg_type = IVar2;
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               &local_48);
    IVar2 = impl->cmpxchg_type;
  }
  this_02 = Converter::Impl::allocate(impl,OpCompositeConstruct,(Value *)instruction,IVar2);
  local_54 = this_00->id;
  local_50 = this_01->id;
  local_48._M_len = 2;
  local_48._M_array = &local_54;
  Operation::add_ids(this_02,&local_48);
  Converter::Impl::add(impl,this_02,false);
  return true;
}

Assistant:

bool emit_cmpxchg_instruction(Converter::Impl &impl, const llvm::AtomicCmpXchgInst *instruction)
{
	auto &builder = impl.builder();

	unsigned bits = instruction->getType()->getStructElementType(0)->getIntegerBitWidth();
	if (bits == 64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	Operation *atomic_op = impl.allocate(spv::OpAtomicCompareExchange, builder.makeUintType(bits));
	if (needs_group_shared_auto_barrier(impl, instruction->getPointerOperand()))
		atomic_op->flags |= Operation::AutoGroupSharedBarrier;

	atomic_op->add_id(impl.get_id_for_value(instruction->getPointerOperand()));

	atomic_op->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));
	atomic_op->add_id(builder.makeUintConstant(0));
	atomic_op->add_id(builder.makeUintConstant(0));
	atomic_op->add_id(impl.get_id_for_value(instruction->getNewValOperand()));
	atomic_op->add_id(impl.get_id_for_value(instruction->getCompareOperand()));

	impl.add(atomic_op);

	Operation *cmp_op = impl.allocate(spv::OpIEqual, builder.makeBoolType());
	cmp_op->add_ids({ atomic_op->id, impl.get_id_for_value(instruction->getCompareOperand()) });
	impl.add(cmp_op);

	if (!impl.cmpxchg_type)
		impl.cmpxchg_type =
		    impl.get_struct_type({ builder.makeUintType(bits), builder.makeBoolType() }, 0, "CmpXchgResult");

	Operation *op = impl.allocate(spv::OpCompositeConstruct, instruction, impl.cmpxchg_type);
	op->add_ids({ atomic_op->id, cmp_op->id });
	impl.add(op);

	return true;
}